

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O0

void __thiscall
icu_63::SimpleFactory::updateVisibleIDs(SimpleFactory *this,Hashtable *result,UErrorCode *status)

{
  UErrorCode *status_local;
  Hashtable *result_local;
  SimpleFactory *this_local;
  
  if (this->_visible == '\0') {
    Hashtable::remove(result,(char *)&this->_id);
  }
  else {
    Hashtable::put(result,&this->_id,this,status);
  }
  return;
}

Assistant:

void 
SimpleFactory::updateVisibleIDs(Hashtable& result, UErrorCode& status) const 
{
    if (_visible) {
        result.put(_id, (void*)this, status); // cast away const
    } else {
        result.remove(_id);
    }
}